

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal_PDU.cpp
# Opt level: O2

KBOOL __thiscall KDIS::PDU::Signal_PDU::operator==(Signal_PDU *this,Signal_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  
  KVar1 = Radio_Communications_Header::operator!=
                    (&this->super_Radio_Communications_Header,
                     &Value->super_Radio_Communications_Header);
  if ((((!KVar1) &&
       (KVar1 = DATA_TYPE::EncodingScheme::operator!=
                          (&this->m_EncodingScheme,&Value->m_EncodingScheme), !KVar1)) &&
      (this->m_ui32SampleRate == Value->m_ui32SampleRate)) &&
     ((this->m_ui16DataLength == Value->m_ui16DataLength &&
      (this->m_ui16Samples == Value->m_ui16Samples)))) {
    bVar2 = std::operator!=(&this->m_vData,&Value->m_vData);
    return !bVar2;
  }
  return false;
}

Assistant:

KBOOL Signal_PDU::operator == ( const Signal_PDU & Value ) const
{
    if( Radio_Communications_Header::operator !=( Value ) )               return false;
    if( m_EncodingScheme                      != Value.m_EncodingScheme ) return false;
    if( m_ui32SampleRate                      != Value.m_ui32SampleRate ) return false;
    if( m_ui16DataLength                      != Value.m_ui16DataLength ) return false;
    if( m_ui16Samples                         != Value.m_ui16Samples )    return false;
    if( m_vData                               != Value.m_vData )          return false;
    return true;
}